

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_3,_3>,_tcu::Matrix<double,_3,_3>_>::call
          (unary<tcu::Matrix<double,_3,_3>,_tcu::Matrix<double,_3,_3>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined8 *puVar1;
  int row_2;
  undefined1 *puVar2;
  GLdouble *data;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar9;
  undefined8 uVar10;
  Matrix<double,_3,_3> arg;
  Matrix<double,_3,_3> result;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_a8 [10];
  undefined1 local_58 [72];
  long lVar8;
  
  puVar2 = local_f8;
  puVar1 = local_a8;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[8] = 0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar6 = _DAT_019fcc00;
    do {
      bVar9 = SUB164(auVar6 ^ _DAT_019f5ce0,4) == DAT_01a45900._4_4_ &&
              SUB164(auVar6 ^ _DAT_019f5ce0,0) < DAT_01a45900;
      if (bVar9) {
        uVar10 = 0x3ff0000000000000;
        if (lVar3 != lVar5) {
          uVar10 = 0;
        }
        *(undefined8 *)((long)puVar1 + lVar5) = uVar10;
      }
      if (bVar9) {
        uVar10 = 0x3ff0000000000000;
        if (lVar3 + -0x18 != lVar5) {
          uVar10 = 0;
        }
        *(undefined8 *)((long)puVar1 + lVar5 + 0x18) = uVar10;
      }
      lVar8 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0x60);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x18;
    puVar1 = puVar1 + 1;
  } while (lVar4 != 3);
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_b8 = 0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    auVar7 = _DAT_019fcc00;
    do {
      bVar9 = SUB164(auVar7 ^ _DAT_019f5ce0,4) == DAT_01a45900._4_4_ &&
              SUB164(auVar7 ^ _DAT_019f5ce0,0) < DAT_01a45900;
      if (bVar9) {
        uVar10 = 0x3ff0000000000000;
        if (lVar3 != lVar5) {
          uVar10 = 0;
        }
        *(undefined8 *)(puVar2 + lVar5) = uVar10;
      }
      if (bVar9) {
        uVar10 = 0x3ff0000000000000;
        if (lVar3 + -0x18 != lVar5) {
          uVar10 = 0;
        }
        *(undefined8 *)(puVar2 + lVar5 + 0x18) = uVar10;
      }
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
      lVar5 = lVar5 + 0x30;
    } while (lVar5 != 0x60);
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x18;
    puVar2 = puVar2 + 8;
  } while (lVar4 != 3);
  lVar3 = 0;
  do {
    *(undefined8 *)(local_e8 + lVar3) = *(undefined8 *)((long)argument_src + lVar3 + 0x10);
    uVar10 = ((undefined8 *)((long)argument_src + lVar3))[1];
    *(undefined8 *)(local_f8 + lVar3) = *(undefined8 *)((long)argument_src + lVar3);
    *(undefined8 *)(local_f8 + lVar3 + 8) = uVar10;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  puVar2 = local_58;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(puVar2,local_f8);
  puVar1 = local_a8;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)puVar1 + lVar4) = *(undefined8 *)(puVar2 + lVar4);
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x48);
    lVar3 = lVar3 + 1;
    puVar1 = puVar1 + 1;
    puVar2 = puVar2 + 8;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)result_dst + lVar3 + 0x10) =
         *(undefined8 *)((long)local_a8 + lVar3 + 0x10);
    uVar10 = *(undefined8 *)((long)local_a8 + lVar3 + 8);
    *(undefined8 *)((long)result_dst + lVar3) = *(undefined8 *)((long)local_a8 + lVar3);
    ((undefined8 *)((long)result_dst + lVar3))[1] = uVar10;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}